

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dna_bwt.hpp
# Opt level: O2

p_range * __thiscall
dna_bwt<dna_string>::LF(p_range *__return_storage_ptr__,dna_bwt<dna_string> *this,range_t rn)

{
  uint64_t uVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  uint64_t uVar6;
  p_rank start;
  p_rank local_68;
  p_rank local_48;
  
  dna_string::parallel_rank(&local_68,&this->BWT,rn.first);
  uVar3 = local_68.G;
  uVar4 = local_68.T;
  uVar5 = local_68.A;
  uVar6 = local_68.C;
  if (rn.first < rn.second) {
    dna_string::parallel_rank(&local_48,&this->BWT,rn.second);
    uVar3 = local_48.G;
    uVar4 = local_48.T;
    uVar5 = local_48.A;
    uVar6 = local_48.C;
  }
  uVar1 = this->F_A;
  uVar2 = this->F_C;
  (__return_storage_ptr__->C).first = local_68.C + uVar2;
  (__return_storage_ptr__->C).second = uVar6 + uVar2;
  (__return_storage_ptr__->A).first = local_68.A + uVar1;
  (__return_storage_ptr__->A).second = uVar5 + uVar1;
  uVar5 = this->F_G;
  uVar6 = this->F_T;
  (__return_storage_ptr__->T).first = local_68.T + uVar6;
  (__return_storage_ptr__->T).second = uVar4 + uVar6;
  (__return_storage_ptr__->G).first = local_68.G + uVar5;
  (__return_storage_ptr__->G).second = uVar3 + uVar5;
  return __return_storage_ptr__;
}

Assistant:

p_range LF(range_t rn){

		assert(rn.second >= rn.first);

		//number of A,C,T,G before start of interval
		p_rank start = BWT.parallel_rank(rn.first);

		//number of A,C,T,G before end of interval (last position of interval included)
		p_rank end;

		if(rn.second>rn.first)
			end	= BWT.parallel_rank(rn.second);
		else
			end = start;

		assert(start <= end);

		p_rank f = {F_A,F_C,F_G,F_T};
		p_rank l = f + start;
		p_rank r = f + end;

		assert(r.A <= l.C);
		assert(r.C <= l.G);
		assert(r.G <= l.T);
		assert(l.T <= n);

		return fold_ranks(l,r);

	}